

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  int iVar1;
  bool bVar2;
  Type *pTVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  CropLayerParams *pCVar6;
  BorderAmounts *pBVar7;
  string *this_02;
  _Rb_tree_header *p_Var8;
  string err;
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Result r;
  string local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,2);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  bVar2 = Result::good(&r);
  if (!bVar2) goto LAB_0024e6a4;
  if (this->ndArrayInterpretation != true) goto LAB_0024e5a7;
  std::__cxx11::string::string((string *)&local_50,"Crop",(allocator *)&err_1);
  this_00 = &this->blobNameToRank;
  validateInputOutputRankEquality((Result *)&err,layer,&local_50,this_00);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = Result::good(&r);
  if (bVar2) {
    std::__cxx11::string::string((string *)&err_1,"Crop",(allocator *)&local_d8);
    validateRankCount((Result *)&err,layer,&err_1,3,-1,this_00);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    std::__cxx11::string::~string((string *)&err_1);
    bVar2 = Result::good(&r);
    if (bVar2) {
      if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
LAB_0024e5a7:
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
          pCVar6 = Specification::NeuralNetworkLayer::crop(layer);
          pBVar7 = pCVar6->cropamounts_;
          if (pBVar7 == (BorderAmounts *)0x0) {
            pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
          }
          if ((pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 2)
          goto LAB_0024e6a4;
          std::operator+(&local_b8,"cropAmounts parameter for the crop layer \'",(layer->name_).ptr_
                        );
          std::operator+(&local_d8,&local_b8,"\' is of length ");
          pCVar6 = Specification::NeuralNetworkLayer::crop(layer);
          pBVar7 = pCVar6->cropamounts_;
          if (pBVar7 == (BorderAmounts *)0x0) {
            pBVar7 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
          }
          std::__cxx11::to_string
                    (&local_70,(pBVar7->borderamounts_).super_RepeatedPtrFieldBase.current_size_);
          std::operator+(&err,&local_d8,&local_70);
          std::operator+(&err_1,&err," but requires exactly two crop constraints (for X,Y axes).");
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_b8);
          Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
        }
        else {
          pCVar6 = Specification::NeuralNetworkLayer::crop(layer);
          if ((pCVar6->offset_).current_size_ == 2) goto LAB_0024e6a4;
          std::operator+(&local_b8,"Offset parameter for the crop layer \'",(layer->name_).ptr_);
          std::operator+(&local_d8,&local_b8,"\' is of length ");
          pCVar6 = Specification::NeuralNetworkLayer::crop(layer);
          std::__cxx11::to_string(&local_70,(pCVar6->offset_).current_size_);
          std::operator+(&err,&local_d8,&local_70);
          std::operator+(&err_1,&err," but requires exactly two offsets (for X,Y axes).");
          std::__cxx11::string::~string((string *)&err);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_b8);
          Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_1);
        }
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        Result::Result(__return_storage_ptr__,&r);
        this_02 = &err_1;
      }
      else {
        this_01 = &layer->input_;
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,0);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar3);
        p_Var8 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar4._M_node == p_Var8) goto LAB_0024e5a7;
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,1);
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,pTVar3);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var8) goto LAB_0024e5a7;
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(this_00,pTVar3);
        iVar1 = *pmVar5;
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,1);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(this_00,pTVar3);
        if (iVar1 == *pmVar5) goto LAB_0024e5a7;
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&local_b8,(string *)(layer->name_).ptr_);
        std::operator+(&local_d8,"Layer \'",&local_b8);
        std::operator+(&err_1,&local_d8,
                       "\' of type \'Crop\' expects equal ranks for its inputs, but they are not equal."
                      );
        std::__cxx11::string::operator=((string *)&err,(string *)&err_1);
        std::__cxx11::string::~string((string *)&err_1);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_b8);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        this_02 = &err;
      }
      std::__cxx11::string::~string((string *)this_02);
      goto LAB_0024e6b4;
    }
  }
LAB_0024e6a4:
  Result::Result(__return_storage_ptr__,&r);
LAB_0024e6b4:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Crop", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Crop", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        }
    }

    return r;
}